

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * CTcPrsOpUnary::parse_primary(void)

{
  ulong uVar1;
  ulong uVar2;
  CTcTokenizer *this;
  int iVar3;
  tc_toktyp_t tVar4;
  CTcToken *pCVar5;
  CTcPrsNode *pCVar6;
  undefined **ppuVar7;
  CTPNAnonFunc *pCVar8;
  CTPNInlineObject *pCVar9;
  CTPNDstr *pCVar10;
  undefined *puVar11;
  CTcSymFunc *this_00;
  CTcSymBif *this_01;
  uint32_t uVar12;
  int is_method;
  CTcToken *in_RSI;
  char *pcVar13;
  bool bVar14;
  CTcConstVal cval;
  CTcToken tok2;
  CTcEmbedBuilderDbl builder;
  CTcToken tok;
  
  cval.typ_ = TC_CVT_UNK;
  cval._32_1_ = 0;
LAB_001fd0ab:
  this = G_tok;
  tVar4 = (G_tok->curtok_).typ_;
  iVar3 = 0x2b13;
  switch(tVar4) {
  case TOKT_SYM:
    pCVar10 = (CTPNDstr *)
              CTcParser::create_sym_node(G_prs,(G_tok->curtok_).text_,(G_tok->curtok_).text_len_);
    break;
  case TOKT_INT:
    goto switchD_001fd0c8_caseD_9;
  case TOKT_SSTR_START:
    ppuVar7 = &PTR_is_double_0030b3f8;
    goto LAB_001fd595;
  case TOKT_SSTR_MID:
  case TOKT_SSTR_END:
  case TOKT_COMMA:
  case TOKT_DOT:
  case TOKT_EQ:
  case TOKT_EQEQ:
  case TOKT_ASI:
  case TOKT_PLUS:
  case TOKT_MINUS:
  case TOKT_TIMES:
  case TOKT_DIV:
  case TOKT_MOD:
  case TOKT_GT:
  case TOKT_LT:
  case TOKT_GE:
  case TOKT_LE:
  case TOKT_NE:
  case TOKT_ARROW:
  case TOKT_COLON:
    goto switchD_001fd0c8_caseD_c;
  case TOKT_DSTR:
    if ((G_prs->field_0xec & 1) == 0) {
      G_prs->self_referenced_ = 1;
      pCVar10 = (CTPNDstr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x18,(size_t)in_RSI);
      CTPNDstr::CTPNDstr(pCVar10,(G_tok->curtok_).text_,(G_tok->curtok_).text_len_);
      break;
    }
  case TOKT_SSTR:
    in_RSI = &G_tok->curtok_;
    CTcConstVal::set_sstr(&cval,in_RSI);
LAB_001fd6af:
    CTcTokenizer::next(G_tok);
LAB_001fd6b7:
    pCVar10 = (CTPNDstr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)in_RSI);
    (pCVar10->super_CTPNDstrBase).str_ = (char *)CONCAT44(cval._4_4_,cval.typ_);
    (pCVar10->super_CTPNDstrBase).len_ = cval.val_.intval_;
    pCVar10[1].super_CTPNDstrBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)cval.val_.floatval_.len_;
    pCVar10[1].super_CTPNDstrBase.str_ =
         (char *)CONCAT44(cval.val_._20_4_,cval.val_.strval_.pool_ofs_);
    *(undefined1 *)&pCVar10[1].super_CTPNDstrBase.len_ = cval._32_1_;
    puVar11 = &CTPNConst::vtable;
LAB_001fd6e2:
    (pCVar10->super_CTPNDstrBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
         (_func_int **)(puVar11 + 0x10);
    return (CTcPrsNode *)pCVar10;
  case TOKT_DSTR_START:
    G_prs->self_referenced_ = 1;
    ppuVar7 = &PTR_is_double_0030b380;
LAB_001fd595:
    builder.super_CTcEmbedBuilder._vptr_CTcEmbedBuilder = (CTcEmbedBuilder)(CTcEmbedBuilder)ppuVar7;
    pCVar10 = (CTPNDstr *)parse_embedding(&builder.super_CTcEmbedBuilder);
    return (CTcPrsNode *)pCVar10;
  case TOKT_DSTR_MID:
  case TOKT_DSTR_END:
  case TOKT_RBRACE:
  case TOKT_SEM:
    in_RSI = (CTcToken *)0x2b15;
    CTcTokenizer::log_error_curtok(G_tok,0x2b15);
    cval.val_.intval_ = (G_tok->curtok_).int_val_;
    cval.typ_ = TC_CVT_INT;
    goto LAB_001fd6b7;
  case TOKT_RESTR:
    cval.typ_ = TC_CVT_RESTR;
    cval.val_.intval_ = (long)(G_tok->curtok_).text_;
    cval.val_.floatval_.len_ = (G_tok->curtok_).text_len_;
    cval.val_.strval_.pool_ofs_ = 0;
    goto LAB_001fd6af;
  case TOKT_LPAR:
    CTcTokenizer::next(G_tok);
    pCVar10 = (CTPNDstr *)CTcPrsOpBin::parse(&S_op_comma.super_CTcPrsOpBin);
    if (pCVar10 == (CTPNDstr *)0x0) {
      return (CTcPrsNode *)(CTPNDstr *)0x0;
    }
    if ((G_tok->curtok_).typ_ != TOKT_RPAR) {
      CTcTokenizer::log_error_curtok(G_tok,0x2b04);
      return (CTcPrsNode *)pCVar10;
    }
    break;
  case TOKT_RPAR:
    goto switchD_001fd0c8_caseD_14;
  case TOKT_LBRACE:
    iVar3 = 1;
LAB_001fd626:
    is_method = 0;
LAB_001fd628:
    pCVar8 = parse_anon_func(iVar3,is_method);
    return (CTcPrsNode *)pCVar8;
  case TOKT_LBRACK:
    pCVar6 = parse_list();
    return pCVar6;
  case TOKT_RBRACK:
    iVar3 = 0x2b14;
    goto switchD_001fd0c8_caseD_14;
  default:
    switch(tVar4) {
    case TOKT_DELEGATED:
      pCVar6 = parse_delegated();
      return pCVar6;
    case TOKT_TARGETPROP:
      G_prs->full_method_ctx_referenced_ = 1;
      CTcTokenizer::next(this);
      pCVar10 = (CTPNDstr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x8,(size_t)in_RSI);
      puVar11 = &CTPNTargetprop::vtable;
      break;
    case TOKT_PROPERTYSET:
    case TOKT_TRANSIENT:
    case TOKT_PROPERTY:
    case TOKT_OPERATOR:
      goto switchD_001fd0c8_caseD_c;
    case TOKT_TARGETOBJ:
      G_prs->full_method_ctx_referenced_ = 1;
      CTcTokenizer::next(this);
      pCVar10 = (CTPNDstr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x8,(size_t)in_RSI);
      puVar11 = &CTPNTargetobj::vtable;
      break;
    case TOKT_DEFININGOBJ:
      G_prs->full_method_ctx_referenced_ = 1;
      CTcTokenizer::next(this);
      pCVar10 = (CTPNDstr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x8,(size_t)in_RSI);
      puVar11 = &CTPNDefiningobj::vtable;
      break;
    case TOKT_REPLACED:
      CTcTokenizer::next(G_tok);
      pCVar10 = (CTPNDstr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x8,(size_t)in_RSI);
      puVar11 = &CTPNReplaced::vtable;
      break;
    case TOKT_METHOD:
switchD_001fd2a2_caseD_80:
      is_method = 1;
      iVar3 = 0;
      goto LAB_001fd628;
    case TOKT_INVOKEE:
      CTcTokenizer::next(G_tok);
      pCVar10 = (CTPNDstr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x8,(size_t)in_RSI);
      puVar11 = &CTPNInvokee::vtable;
      break;
    default:
      switch(tVar4) {
      case TOKT_POUND:
        pCVar5 = CTcTokenizer::copycur(G_tok);
        tok._32_1_ = pCVar5->field_0x20;
        tok.typ_ = pCVar5->typ_;
        tok._4_4_ = *(undefined4 *)&pCVar5->field_0x4;
        tok.text_ = pCVar5->text_;
        tok.text_len_ = pCVar5->text_len_;
        tok.int_val_ = pCVar5->int_val_;
        if (((G_prs->field_0xec & 8) != 0) && (tVar4 = CTcTokenizer::next(G_tok), tVar4 == TOKT_SYM)
           ) {
          pCVar5 = CTcTokenizer::copycur(G_tok);
          tok2.typ_ = pCVar5->typ_;
          tok2._4_4_ = *(undefined4 *)&pCVar5->field_0x4;
          tok2.text_ = pCVar5->text_;
          tok2.text_len_ = pCVar5->text_len_;
          tok2.int_val_ = pCVar5->int_val_;
          tok2._32_1_ = pCVar5->field_0x20;
          iVar3 = CTcToken::text_matches(&tok2,"__obj",5);
          if ((((iVar3 != 0) ||
               (((iVar3 = CTcToken::text_matches(&tok2,"__obj",5), iVar3 != 0 ||
                 (iVar3 = CTcToken::text_matches(&tok2,"__prop",6), iVar3 != 0)) ||
                (iVar3 = CTcToken::text_matches(&tok2,"__sstr",6), iVar3 != 0)))) ||
              (((iVar3 = CTcToken::text_matches(&tok2,"__list",6), iVar3 != 0 ||
                (iVar3 = CTcToken::text_matches(&tok2,"__func",6), iVar3 != 0)) ||
               (iVar3 = CTcToken::text_matches(&tok2,"__enum",6), iVar3 != 0)))) ||
             (iVar3 = CTcToken::text_matches(&tok2,"__bifptr",8), iVar3 != 0)) {
            tVar4 = CTcTokenizer::next(G_tok);
            if (tVar4 == TOKT_INT) {
              uVar1 = (G_tok->curtok_).int_val_;
              CTcTokenizer::next(G_tok);
              pcVar13 = "__obj";
              iVar3 = CTcToken::text_matches(&tok2,"__obj",5);
              cval.val_.enumval_ = uVar1;
              if (iVar3 == 0) {
                pcVar13 = "__prop";
                iVar3 = CTcToken::text_matches(&tok2,"__prop",6);
                uVar12 = (uint32_t)uVar1;
                if (iVar3 == 0) {
                  pcVar13 = "__sstr";
                  iVar3 = CTcToken::text_matches(&tok2,"__sstr",6);
                  if (iVar3 == 0) {
                    pcVar13 = "__list";
                    iVar3 = CTcToken::text_matches(&tok2,"__list",6);
                    if (iVar3 == 0) {
                      pcVar13 = "__func";
                      iVar3 = CTcToken::text_matches(&tok2,"__func",6);
                      if (iVar3 == 0) {
                        pcVar13 = "__enum";
                        iVar3 = CTcToken::text_matches(&tok2,"__enum",6);
                        if (iVar3 == 0) {
                          pcVar13 = "__bifptr";
                          iVar3 = CTcToken::text_matches(&tok2,"__bifptr",8);
                          if (iVar3 == 0) goto switchD_001fd0c8_caseD_c;
                          uVar2 = (G_tok->curtok_).int_val_;
                          CTcTokenizer::next(G_tok);
                          this_01 = (CTcSymBif *)
                                    CTcSymbolBase::operator_new
                                              ((CTcSymbolBase *)0x38,(size_t)pcVar13);
                          pcVar13 = ".anon";
                          CTcSymBif::CTcSymBif
                                    (this_01,".anon",5,0,(ushort)uVar1,(ushort)uVar2,0,0,0,0);
                          cval.typ_ = TC_CVT_BIFPTR;
                          cval.val_.bifptrval_ = this_01;
                        }
                        else {
                          cval.typ_ = TC_CVT_ENUM;
                        }
                      }
                      else {
                        this_00 = (CTcSymFunc *)
                                  CTcSymbolBase::operator_new((CTcSymbolBase *)0x98,(size_t)pcVar13)
                        ;
                        CTcSymFunc::CTcSymFunc(this_00,".anon",5,0,0,0,0,0,0,0,0,1);
                        pcVar13 = (char *)(uVar1 & 0xffffffff);
                        (*(this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.
                          super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x22])(this_00)
                        ;
                        cval.typ_ = TC_CVT_FUNCPTR;
                        cval.val_.funcptrval_ = this_00;
                      }
                    }
                    else {
                      cval.typ_ = TC_CVT_LIST;
                      cval.val_.intval_ = 0;
                      cval.val_.listval_.pool_ofs_ = uVar12;
                    }
                  }
                  else {
                    cval.typ_ = TC_CVT_SSTR;
                    cval.val_.intval_ = 0;
                    cval.val_.floatval_.len_ = 0;
                    cval.val_.strval_.pool_ofs_ = uVar12;
                  }
                }
                else {
                  cval.typ_ = TC_CVT_PROP;
                  cval.val_.propval_ = uVar12;
                }
              }
              else {
                cval.typ_ = TC_CVT_OBJ;
                cval.val_.listval_.pool_ofs_ = 0xffffffff;
              }
              pCVar10 = (CTPNDstr *)
                        CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)pcVar13);
              (pCVar10->super_CTPNDstrBase).str_ = (char *)CONCAT44(cval._4_4_,cval.typ_);
              (pCVar10->super_CTPNDstrBase).len_ = cval.val_.intval_;
              pCVar10[1].super_CTPNDstrBase.super_CTcPrsNode.super_CTcPrsNodeBase.
              _vptr_CTcPrsNodeBase = (_func_int **)cval.val_.floatval_.len_;
              pCVar10[1].super_CTPNDstrBase.str_ =
                   (char *)CONCAT44(cval.val_._20_4_,cval.val_.strval_.pool_ofs_);
              *(undefined1 *)&pCVar10[1].super_CTPNDstrBase.len_ = cval._32_1_;
              puVar11 = &CTPNDebugConst::vtable;
              goto LAB_001fd6e2;
            }
            CTcTokenizer::unget(G_tok,&tok2);
          }
        }
        CTcTokenizer::unget(G_tok,&tok);
      case TOKT_POUNDPOUND:
      case TOKT_POUNDAT:
      case TOKT_ELLIPSIS:
      case TOKT_QUESTION:
      case TOKT_QQ:
      case TOKT_COLONCOLON:
      case TOKT_AT:
      case TOKT_DOTDOT:
      case TOKT_FMTSPEC:
switchD_001fd0c8_caseD_c:
        in_RSI = (CTcToken *)0x2b05;
        CTcTokenizer::log_error_curtok(G_tok,0x2b05);
        CTcTokenizer::next(G_tok);
switchD_001fd0c8_caseD_9:
        cval.val_.intval_ = (G_tok->curtok_).int_val_;
        cval.typ_ = TC_CVT_INT;
        break;
      case TOKT_FLOAT:
        cval.val_.intval_ = (long)(G_tok->curtok_).text_;
        cval.val_.floatval_.len_ = (G_tok->curtok_).text_len_;
        cval.typ_ = TC_CVT_FLOAT;
        cval._32_1_ = 0;
        break;
      case TOKT_BIGINT:
        cval.val_.intval_ = (long)(G_tok->curtok_).text_;
        cval.val_.floatval_.len_ = (G_tok->curtok_).text_len_;
        cval.typ_ = TC_CVT_FLOAT;
        cval._32_1_ = 2;
        break;
      case TOKT_SELF:
        G_prs->self_referenced_ = 1;
        CTcTokenizer::next(this);
        pCVar10 = (CTPNDstr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x8,(size_t)in_RSI);
        puVar11 = &CTPNSelf::vtable;
        goto LAB_001fd6e2;
      case TOKT_INHERITED:
        pCVar6 = parse_inherited();
        return pCVar6;
      case TOKT_ARGCOUNT:
        CTcTokenizer::next(G_tok);
        pCVar10 = (CTPNDstr *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x8,(size_t)in_RSI);
        puVar11 = &CTPNArgc::vtable;
        goto LAB_001fd6e2;
      default:
        switch(tVar4) {
        case TOKT_FUNCTION:
switchD_001fd2cc_caseD_5c:
          iVar3 = 0;
          goto LAB_001fd626;
        case TOKT_RETURN:
        case TOKT_LOCAL:
          goto switchD_001fd0c8_caseD_c;
        case TOKT_OBJECT:
          pCVar9 = parse_inline_object(0);
          return (CTcPrsNode *)pCVar9;
        case TOKT_NIL:
          cval.typ_ = TC_CVT_NIL;
          break;
        case TOKT_TRUE:
          cval.typ_ = TC_CVT_TRUE;
          break;
        default:
          if (tVar4 == TOKT_NEW) {
            tVar4 = CTcTokenizer::next(G_tok);
            if (tVar4 == TOKT_METHOD) goto switchD_001fd2a2_caseD_80;
            if (tVar4 != TOKT_FUNCTION) {
              bVar14 = (G_tok->curtok_).typ_ == TOKT_TRANSIENT;
              if (bVar14) {
                CTcTokenizer::next(G_tok);
              }
              pCVar6 = parse_primary();
              if ((G_tok->curtok_).typ_ == TOKT_LPAR) {
                pCVar6 = parse_call(pCVar6);
              }
              pCVar6 = parse_new(pCVar6,(uint)bVar14);
              return pCVar6;
            }
            goto switchD_001fd2cc_caseD_5c;
          }
          goto switchD_001fd0c8_caseD_c;
        }
      }
      goto LAB_001fd6af;
    }
    goto LAB_001fd6e2;
  }
  CTcTokenizer::next(G_tok);
  return (CTcPrsNode *)pCVar10;
switchD_001fd0c8_caseD_14:
  CTcTokenizer::log_error(iVar3);
  CTcTokenizer::next(G_tok);
  goto LAB_001fd0ab;
}

Assistant:

vbignum_t *CTcPrsOpDiv::calc_result(
    const vbignum_t &a, const vbignum_t &b) const
{
    /* check for division by zero */
    if (b.is_zero())
    {
        /* log an error, and just return the left operand */
        G_tok->log_error(TCERR_CONST_DIV_ZERO);
        return new vbignum_t(1L);
    }
    else
    {
        /* calculate the result */
        return a / b;
    }
}